

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O3

int coda_ascii_cursor_read_uint8(coda_cursor *cursor,uint8_t *dst)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  uint64_t value;
  ulong local_18;
  
  local_18 = in_RAX;
  iVar1 = coda_ascii_cursor_read_uint64(cursor,&local_18);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (local_18 < 0x100) {
      *dst = (uint8_t)local_18;
      iVar2 = 0;
    }
    else {
      coda_set_error(-300,"product error detected (value for ascii integer too large for uint8)");
    }
  }
  return iVar2;
}

Assistant:

int coda_ascii_cursor_read_uint8(const coda_cursor *cursor, uint8_t *dst)
{
    uint64_t value;

    if (coda_ascii_cursor_read_uint64(cursor, &value) != 0)
    {
        return -1;
    }
    if (value > MAXUINT8)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (value for ascii integer too large for uint8)");
        return -1;
    }
    *dst = (uint8_t)value;

    return 0;
}